

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O1

void calc<double>(string *Ja_in,string *Jb_in,string *Jc_in)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 uVar8;
  double dVar9;
  undefined4 uVar10;
  char *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pcVar1 = (Ja_in->_M_dataplus)._M_p;
  piVar3 = __errno_location();
  iVar7 = *piVar3;
  *piVar3 = 0;
  local_40 = strtod(pcVar1,&local_58);
  if ((char *)CONCAT71(local_58._1_7_,local_58._0_1_) == pcVar1) {
    std::__throw_invalid_argument("stod");
  }
  else {
    if (*piVar3 == 0) {
LAB_0010717b:
      *piVar3 = iVar7;
    }
    else if (*piVar3 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0010717b;
    }
    pcVar1 = (Jb_in->_M_dataplus)._M_p;
    iVar7 = *piVar3;
    *piVar3 = 0;
    dVar9 = strtod(pcVar1,&local_58);
    if ((char *)CONCAT71(local_58._1_7_,local_58._0_1_) != pcVar1) {
      local_48 = dVar9;
      if (*piVar3 == 0) {
LAB_001071bd:
        *piVar3 = iVar7;
      }
      else if (*piVar3 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_001071bd;
      }
      pcVar1 = (Jc_in->_M_dataplus)._M_p;
      iVar7 = *piVar3;
      *piVar3 = 0;
      dVar9 = strtod(pcVar1,&local_58);
      if ((char *)CONCAT71(local_58._1_7_,local_58._0_1_) != pcVar1) {
        uVar8 = SUB84(dVar9,0);
        uVar10 = (undefined4)((ulong)dVar9 >> 0x20);
        if (*piVar3 != 0) {
          if (*piVar3 != 0x22) goto LAB_001071fd;
          std::__throw_out_of_range("stod");
        }
        *piVar3 = iVar7;
LAB_001071fd:
        local_38 = (double)CONCAT44(uVar10,uVar8);
        local_50 = ising::tc::triangular<double>(local_40,local_48,(double)CONCAT44(uVar10,uVar8));
        lVar2 = std::cout;
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
             0x100;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0xf;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# lattice: triangular\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# precision: ",0xd);
        plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,0xf);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# Ja Jb Jc Tc 1/Tc",0x12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar5 = std::ostream::_M_insert<double>(local_40);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>(local_48);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>(local_38);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>(local_50);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>(1.0 / local_50);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        return;
      }
      goto LAB_001073dc;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_001073dc:
  uVar6 = std::__throw_invalid_argument("stod");
  if (*piVar3 == 0) {
    *piVar3 = iVar7;
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void calc(const std::string& Ja_in, const std::string& Jb_in, const std::string& Jc_in) {
  typedef T real_t;
  real_t Ja = convert<real_t>(Ja_in);
  real_t Jb = convert<real_t>(Jb_in);
  real_t Jc = convert<real_t>(Jc_in);
  auto tc = ising::tc::triangular(Ja, Jb, Jc);
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10 << std::endl
            << "# Ja Jb Jc Tc 1/Tc" << std::endl
            << Ja << ' ' << Jb << ' ' << Jc << ' ' << tc << ' ' << (1 / tc) << std::endl;
}